

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

void Fossilize::StreamArchive::convert_from_le(PayloadHeader *header,PayloadHeaderRaw *raw)

{
  header->payload_size = *(uint32_t *)raw->data;
  header->format = *(uint32_t *)(raw->data + 4);
  header->crc = *(uint32_t *)(raw->data + 8);
  header->uncompressed_size = *(uint32_t *)(raw->data + 0xc);
  return;
}

Assistant:

static void convert_from_le(uint32_t *output, const uint8_t *le_input, unsigned word_count)
	{
		for (unsigned i = 0; i < word_count; i++)
		{
			uint32_t v =
					(uint32_t(le_input[0]) << 0) |
					(uint32_t(le_input[1]) << 8) |
					(uint32_t(le_input[2]) << 16) |
					(uint32_t(le_input[3]) << 24);

			*output++ = v;
			le_input += 4;
		}
	}